

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::ParseState::DoFinish(ParseState *this)

{
  ParseState *this_00;
  ParseState *in_RDI;
  Regexp *re;
  Regexp *local_8;
  
  DoAlternation(in_RDI);
  this_00 = (ParseState *)in_RDI->stacktop_;
  if ((this_00 == (ParseState *)0x0) || ((this_00->whole_regexp_).size_ == 0)) {
    in_RDI->stacktop_ = (Regexp *)0x0;
    local_8 = FinishRegexp(this_00,(Regexp *)in_RDI);
  }
  else {
    RegexpStatus::set_code(in_RDI->status_,kRegexpMissingParen);
    RegexpStatus::set_error_arg(in_RDI->status_,&in_RDI->whole_regexp_);
    local_8 = (Regexp *)0x0;
  }
  return local_8;
}

Assistant:

Regexp* Regexp::ParseState::DoFinish() {
  DoAlternation();
  Regexp* re = stacktop_;
  if (re != NULL && re->down_ != NULL) {
    status_->set_code(kRegexpMissingParen);
    status_->set_error_arg(whole_regexp_);
    return NULL;
  }
  stacktop_ = NULL;
  return FinishRegexp(re);
}